

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClausesBuffer.cc
# Opt level: O0

bool __thiscall
Glucose::ClausesBuffer::getClause
          (ClausesBuffer *this,int threadId,int *threadOrigin,vec<Glucose::Lit> *resultClause,
          bool firstFound)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint *puVar5;
  uint32_t *in_RCX;
  uint32_t *in_RDX;
  uint in_ESI;
  ClausesBuffer *in_RDI;
  byte in_R8B;
  bool bVar6;
  int i;
  int csize;
  bool removeAfter;
  uint previouslast;
  uint thislast;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint32_t *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_40;
  uint local_30;
  bool local_1;
  
  puVar5 = vec<unsigned_int>::operator[](&in_RDI->lastOfThread,in_ESI);
  local_30 = *puVar5;
  uVar1 = nextIndex(in_RDI,local_30);
  if (uVar1 == in_RDI->first) {
    local_1 = false;
  }
  else {
    if ((((local_30 < in_RDI->last) && (in_RDI->last < in_RDI->first)) ||
        ((in_RDI->first < local_30 && (local_30 < in_RDI->last)))) ||
       ((in_RDI->last < in_RDI->first && (in_RDI->first < local_30)))) {
      local_30 = in_RDI->last;
    }
    if ((in_R8B & 1) == 0) {
      while( true ) {
        uVar1 = nextIndex(in_RDI,local_30);
        bVar6 = false;
        if (uVar1 != in_RDI->first) {
          uVar1 = addIndex(in_RDI,local_30,3);
          puVar5 = vec<unsigned_int>::operator[](&in_RDI->elems,uVar1);
          bVar6 = *puVar5 == in_ESI;
        }
        if (!bVar6) break;
        uVar1 = nextIndex(in_RDI,local_30);
        puVar5 = vec<unsigned_int>::operator[](&in_RDI->elems,uVar1);
        local_30 = addIndex(in_RDI,local_30,*puVar5 + 3);
      }
    }
    uVar1 = nextIndex(in_RDI,local_30);
    if (uVar1 == in_RDI->first) {
      puVar5 = vec<unsigned_int>::operator[](&in_RDI->lastOfThread,in_ESI);
      *puVar5 = local_30;
      local_1 = false;
    }
    else {
      uVar2 = noCheckPop((ClausesBuffer *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
      uVar1 = addIndex(in_RDI,local_30,1);
      puVar5 = vec<unsigned_int>::operator[](&in_RDI->elems,uVar1);
      uVar1 = *puVar5;
      *puVar5 = uVar1 - 1;
      uVar3 = nextIndex(in_RDI,local_30);
      uVar4 = noCheckPop((ClausesBuffer *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
      *in_RDX = uVar4;
      vec<Glucose::Lit>::clear
                ((vec<Glucose::Lit> *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 (bool)in_stack_ffffffffffffff8f);
      for (local_40 = 0; local_40 < (int)uVar2; local_40 = local_40 + 1) {
        uVar4 = noCheckPop((ClausesBuffer *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RCX);
        toLit(uVar4);
        vec<Glucose::Lit>::push
                  ((vec<Glucose::Lit> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                   (Lit *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      }
      bVar6 = in_RDI->last == local_30;
      local_30 = uVar3;
      if ((bVar6) && (uVar1 - 1 == 0)) {
        removeLastClause((ClausesBuffer *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        local_30 = in_RDI->last;
      }
      puVar5 = vec<unsigned_int>::operator[](&in_RDI->lastOfThread,in_ESI);
      *puVar5 = local_30;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool ClausesBuffer::getClause(int threadId, int & threadOrigin, vec<Lit> & resultClause,  bool firstFound) {
    assert(lastOfThread.size() > threadId);
    unsigned int thislast = lastOfThread[threadId];
    assert(!firstFound || thislast == last); // FIXME: Gilles has this assertion on his cluster

    // Early exiting
    if (nextIndex(thislast) == first) return false;

    if ( ( thislast < last && last < first) ||
	    ( first < thislast && thislast < last ) ||
	    ( last < first && first < thislast) ) {
	// Special case where last has moved and lastOfThread[threadId] is no more valid (is behind)
	thislast = last; 
    }
    assert(!firstFound);
    // Go to next clause for this thread id
    if (!firstFound) { 
	while (nextIndex(thislast) != first && elems[addIndex(thislast,3)] == ((unsigned int)threadId)) { // 3 = 2 + 1 
	    thislast = addIndex(thislast, elems[nextIndex(thislast)] + headerSize); // 
	    assert(thislast >= 0);
	    assert(thislast < maxsize);
	}
	assert(nextIndex(thislast)==first || elems[addIndex(thislast,3)] != (unsigned int)threadId);
    }

    if (nextIndex(thislast) == first) {
	lastOfThread[threadId] = thislast;
	return false;
    }  
    assert(elems[addIndex(thislast,3)] != ((unsigned int) threadId));
    unsigned int previouslast = thislast;
    bool removeAfter = false;
    int csize = noCheckPop(thislast);
    removeAfter = (--elems[addIndex(thislast,1)] == 0); // We are sure this is not one of our own clause
    thislast = nextIndex(thislast); // Skips the removeAfter fieldr
    threadOrigin = noCheckPop(thislast);
    assert(threadOrigin != threadId);
    resultClause.clear();
    for(int i=0;i<csize;i++) {
	resultClause.push(toLit(noCheckPop(thislast)));
    }
    if (last == previouslast && removeAfter) {
	removeLastClause();
	thislast = last;
    }
    lastOfThread[threadId] = thislast;
    return true;
}